

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Auth.cpp
# Opt level: O1

Url * __thiscall Vault::Sys::Auth::getUrl(Url *__return_storage_ptr__,Auth *this,Path *path)

{
  long *plVar1;
  size_type sVar2;
  pointer pcVar3;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50 [2];
  long local_40 [2];
  
  plVar1 = *(long **)this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/v1/sys/auth","");
  sVar2 = (path->value_)._M_string_length;
  if (sVar2 == 0) {
    local_70 = &local_60;
    pcVar3 = (path->value_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3);
  }
  else {
    Vault::operator+(&local_90,"/",path);
    local_70 = &local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      local_60._8_8_ = local_90.field_2._8_8_;
    }
    else {
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_90._M_dataplus._M_p;
    }
    local_60._M_allocated_capacity._1_7_ = local_90.field_2._M_allocated_capacity._1_7_;
    local_60._M_local_buf[0] = local_90.field_2._M_local_buf[0];
    local_68 = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_50,&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60._M_allocated_capacity + 1);
  }
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Auth::getUrl(const Path &path) const {
  return client_.getUrl("/v1/sys/auth", path.empty() ? path : Path{"/" + path});
}